

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opextinst_forward_ref_fixup_pass.cpp
# Opt level: O2

unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
* __thiscall
spvtools::opt::anon_unknown_11::gatherResultIds
          (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,anon_unknown_11 *this,
          IteratorRange<spvtools::opt::InstructionList::iterator> *range)

{
  Instruction *pIVar1;
  Instruction *this_00;
  uint32_t uVar2;
  undefined8 in_RAX;
  Instruction *it;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  pIVar1 = *(Instruction **)(this + 8);
  uStack_28 = in_RAX;
  while (this_00 = *(Instruction **)this, this_00 != pIVar1) {
    uVar2 = Instruction::result_id(this_00);
    uStack_28 = CONCAT44(uVar2,(undefined4)uStack_28);
    std::__detail::
    _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)__return_storage_ptr__,(value_type *)((long)&uStack_28 + 4));
    this = (anon_unknown_11 *)
           &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<uint32_t> gatherResultIds(
    const IteratorRange<Module::inst_iterator>& range) {
  std::unordered_set<uint32_t> output;
  for (const auto& it : range) output.insert(it.result_id());
  return output;
}